

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.cpp
# Opt level: O1

void __thiscall
CStorage::ListDirectory
          (CStorage *this,int Type,char *pPath,FS_LISTDIR_CALLBACK pfnCallback,void *pUser)

{
  long lVar1;
  char *pcVar2;
  char (*pacVar3) [512];
  long in_FS_OFFSET;
  char aBuffer [512];
  char local_238 [512];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (Type == -1) {
    if (0 < this->m_NumPaths) {
      pacVar3 = this->m_aaStoragePaths;
      lVar1 = 0;
      do {
        pcVar2 = "";
        if ((*pacVar3)[0] != '\0') {
          pcVar2 = "/";
        }
        str_format(local_238,0x200,"%s%s%s",pacVar3,pcVar2,pPath);
        fs_listdir(local_238,pfnCallback,(int)lVar1,pUser);
        lVar1 = lVar1 + 1;
        pacVar3 = pacVar3 + 1;
      } while (lVar1 < this->m_NumPaths);
    }
  }
  else if ((-1 < Type) && (Type < this->m_NumPaths)) {
    pcVar2 = "/";
    if (this->m_aaStoragePaths[(uint)Type][0] == '\0') {
      pcVar2 = "";
    }
    str_format(local_238,0x200,"%s%s%s",this->m_aaStoragePaths + (uint)Type,pcVar2,pPath);
    fs_listdir(local_238,pfnCallback,Type,pUser);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

virtual void ListDirectory(int Type, const char *pPath, FS_LISTDIR_CALLBACK pfnCallback, void *pUser)
	{
		char aBuffer[IO_MAX_PATH_LENGTH];
		if(Type == TYPE_ALL)
		{
			// list all available directories
			for(int i = 0; i < m_NumPaths; ++i)
				fs_listdir(GetPath(i, pPath, aBuffer, sizeof(aBuffer)), pfnCallback, i, pUser);
		}
		else if(Type >= 0 && Type < m_NumPaths)
		{
			// list wanted directory
			fs_listdir(GetPath(Type, pPath, aBuffer, sizeof(aBuffer)), pfnCallback, Type, pUser);
		}
	}